

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprIdToTrueFalse(Expr *pExpr)

{
  u32 uVar1;
  undefined1 *in_RDI;
  u32 v;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (((*(uint *)(in_RDI + 4) & 0x4000800) == 0) &&
     (uVar1 = sqlite3IsTrueOrFalse((char *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffe8)),
     uVar1 != 0)) {
    *in_RDI = 0xab;
    *(u32 *)(in_RDI + 4) = uVar1 | *(uint *)(in_RDI + 4);
    return 1;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprIdToTrueFalse(Expr *pExpr){
  u32 v;
  assert( pExpr->op==TK_ID || pExpr->op==TK_STRING );
  if( !ExprHasProperty(pExpr, EP_Quoted|EP_IntValue)
   && (v = sqlite3IsTrueOrFalse(pExpr->u.zToken))!=0
  ){
    pExpr->op = TK_TRUEFALSE;
    ExprSetProperty(pExpr, v);
    return 1;
  }
  return 0;
}